

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O3

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::AddComponentsToCompositesForLoads
          (InterfaceVariableScalarReplacement *this,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_component_values,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_composites,uint32_t depth_to_component)

{
  IRContext *this_00;
  Instruction *this_01;
  array<signed_char,_4UL> aVar1;
  iterator iVar2;
  Instruction *inst;
  __hashtable *__h;
  _Hash_node_base *p_Var3;
  Instruction *load;
  Instruction *local_a8;
  uint32_t local_9c;
  undefined1 local_98 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_70;
  InterfaceVariableScalarReplacement *local_68;
  DefUseManager *local_60;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  this_00 = (this->super_Pass).context_;
  local_9c = depth_to_component;
  local_68 = this;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  p_Var3 = (loads_to_component_values->_M_h)._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    local_60 = (this_00->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    do {
      local_a8 = (Instruction *)p_Var3[1]._M_nxt;
      this_01 = (Instruction *)p_Var3[2]._M_nxt;
      iVar2 = std::
              _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&loads_to_composites->_M_h,&local_a8);
      if (iVar2.
          super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        inst = CreateCompositeConstructForComponentOfLoad(local_68,local_a8,local_9c);
        local_98._0_8_ = local_a8;
        local_98._8_8_ = inst;
        std::
        _Hashtable<spvtools::opt::Instruction*,std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>
                  ((_Hashtable<spvtools::opt::Instruction*,std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)loads_to_composites,local_98);
      }
      else {
        inst = *(Instruction **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
                       ._M_cur + 0x10);
      }
      aVar1._M_elems[0] = '\0';
      aVar1._M_elems[1] = '\0';
      aVar1._M_elems[2] = '\0';
      aVar1._M_elems[3] = '\0';
      if (this_01->has_result_id_ == true) {
        aVar1._M_elems =
             (_Type)Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
      }
      local_58._0_8_ = &PTR__SmallVector_00b02ef8;
      local_58._24_8_ = local_58 + 0x10;
      local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_58._8_8_ = 1;
      local_98._0_4_ = 1;
      local_98._8_8_ = &PTR__SmallVector_00b02ef8;
      local_98._16_8_ = 0;
      local_98._32_8_ = local_98 + 0x18;
      local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_58._16_4_ = aVar1._M_elems;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_98 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_58);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&inst->operands_,(Operand *)local_98);
      local_98._8_8_ = &PTR__SmallVector_00b02ef8;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_70._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_70,local_70._M_head_impl);
      }
      local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_58._0_8_ = &PTR__SmallVector_00b02ef8;
      if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_38,local_38._M_head_impl);
      }
      analysis::DefUseManager::AnalyzeInstDefUse(local_60,inst);
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::AddComponentsToCompositesForLoads(
    const std::unordered_map<Instruction*, Instruction*>&
        loads_to_component_values,
    std::unordered_map<Instruction*, Instruction*>* loads_to_composites,
    uint32_t depth_to_component) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  for (auto& load_and_component_vale : loads_to_component_values) {
    Instruction* load = load_and_component_vale.first;
    Instruction* component_value = load_and_component_vale.second;
    Instruction* composite_construct = nullptr;
    auto itr = loads_to_composites->find(load);
    if (itr == loads_to_composites->end()) {
      composite_construct =
          CreateCompositeConstructForComponentOfLoad(load, depth_to_component);
      loads_to_composites->insert({load, composite_construct});
    } else {
      composite_construct = itr->second;
    }
    composite_construct->AddOperand(
        {SPV_OPERAND_TYPE_ID, {component_value->result_id()}});
    def_use_mgr->AnalyzeInstDefUse(composite_construct);
  }
}